

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void __thiscall
kratos::StmtException::
print_nodes<__gnu_cxx::__normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>>
          (StmtException *this,
          __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
          begin,__normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
                end)

{
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_28;
  __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  it;
  StmtException *this_local;
  __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  end_local;
  __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  begin_local;
  
  local_28._M_current = begin._M_current;
  it._M_current = (Stmt **)this;
  this_local = (StmtException *)end._M_current;
  end_local._M_current = begin._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
                        *)&this_local);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
              ::operator*(&local_28);
    print_ast_node(&(*ppSVar2)->super_IRNode);
    __gnu_cxx::
    __normal_iterator<kratos::Stmt_*const_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
    ::operator++(&local_28,0);
  }
  return;
}

Assistant:

void StmtException::print_nodes(T begin, T end) noexcept {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}